

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  undefined8 uVar1;
  Select *pSVar2;
  Expr *pLeft;
  char cVar3;
  u8 uVar4;
  undefined1 uVar5;
  u32 uVar6;
  int iVar7;
  Expr *pEVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  Expr *pEVar13;
  Expr *pEVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  Expr *pEVar17;
  long in_FS_OFFSET;
  byte bVar18;
  undefined8 local_70 [9];
  long local_28;
  
  bVar18 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar12 = 0;
  if (pExpr->op != ',') {
    pSVar2 = (pWalker->u).pSelect;
    iVar7 = sqlite3ExprIsConstantOrGroupBy(pWalker->pParse,pExpr,pSVar2->pGroupBy);
    iVar12 = 1;
    if ((((iVar7 != 0) && ((pExpr->flags & 0x20000001) != 0x20000000)) &&
        (pExpr->pAggInfo == (AggInfo *)0x0)) &&
       (pEVar8 = sqlite3Expr(pWalker->pParse->db,0x9c,"1"), pEVar8 != (Expr *)0x0)) {
      pLeft = pSVar2->pWhere;
      puVar15 = local_70;
      lVar11 = 9;
      pEVar13 = pEVar8;
      puVar16 = puVar15;
      for (lVar9 = lVar11; lVar10 = lVar11, pEVar14 = pExpr, pEVar17 = pEVar8, lVar9 != 0;
          lVar9 = lVar9 + -1) {
        *puVar16 = *(undefined8 *)pEVar13;
        pEVar13 = (Expr *)((long)pEVar13 + (ulong)bVar18 * -0x10 + 8);
        puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
      }
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        cVar3 = pEVar14->affExpr;
        uVar4 = pEVar14->op2;
        uVar5 = pEVar14->field_0x3;
        uVar6 = pEVar14->flags;
        pEVar17->op = pEVar14->op;
        pEVar17->affExpr = cVar3;
        pEVar17->op2 = uVar4;
        pEVar17->field_0x3 = uVar5;
        pEVar17->flags = uVar6;
        pEVar14 = (Expr *)((long)pEVar14 + (ulong)bVar18 * -0x10 + 8);
        pEVar17 = (Expr *)((long)pEVar17 + (ulong)bVar18 * -0x10 + 8);
      }
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        uVar1 = *puVar15;
        pExpr->op = (char)uVar1;
        pExpr->affExpr = (char)((ulong)uVar1 >> 8);
        pExpr->op2 = (char)((ulong)uVar1 >> 0x10);
        pExpr->field_0x3 = (char)((ulong)uVar1 >> 0x18);
        pExpr->flags = (int)((ulong)uVar1 >> 0x20);
        puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
        pExpr = (Expr *)((long)pExpr + (ulong)bVar18 * -0x10 + 8);
      }
      pEVar8 = sqlite3ExprAnd(pWalker->pParse,pLeft,pEVar8);
      pSVar2->pWhere = pEVar8;
      pWalker->eCode = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    /* This routine is called before the HAVING clause of the current
    ** SELECT is analyzed for aggregates. So if pExpr->pAggInfo is set
    ** here, it indicates that the expression is a correlated reference to a
    ** column from an outer aggregate query, or an aggregate function that
    ** belongs to an outer query. Do not move the expression to the WHERE
    ** clause in this obscure case, as doing so may corrupt the outer Select
    ** statements AggInfo structure.  */
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy)
     && ExprAlwaysFalse(pExpr)==0
     && pExpr->pAggInfo==0
    ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3Expr(db, TK_INTEGER, "1");
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(pWalker->pParse, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}